

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void __thiscall SGParser::Generator::Lex::CheckForErrorAndReport(Lex *this,char *message,...)

{
  undefined1 local_1c8 [8];
  ParseMessage msg;
  undefined1 local_98 [8];
  va_list argList;
  undefined1 local_78 [8];
  String messageStr;
  String local_38;
  allocator<char> local_11;
  
  if (((this->Messages).Flags & 1) != 0) {
    argList[0].overflow_arg_area = (void *)((long)&msg.FileName.field_2 + 8);
    argList[0]._0_8_ = &stack0x00000008;
    local_98._0_4_ = 0x10;
    local_98._4_4_ = 0x30;
    StringWithVAFormat<char>((String *)local_78,message,(__va_list_tag *)local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(messageStr.field_2._M_local_buf + 8),"",&local_11);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    ParseMessage::ParseMessage
              ((ParseMessage *)local_1c8,ErrorMessage,(String *)((long)&messageStr.field_2 + 8),
               (String *)local_78,0,0xffffffffffffffff,0xffffffffffffffff,&local_38,0);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)(messageStr.field_2._M_local_buf + 8));
    ParseMessageBuffer::AddMessage(&this->Messages,(ParseMessage *)local_1c8);
    ParseMessage::~ParseMessage((ParseMessage *)local_1c8);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void Lex::CheckForErrorAndReport(const char* message...) {
    if (Messages.GetMessageFlags() & ParseMessageBuffer::MessageError) {
        va_list argList;
        va_start(argList, message);
        const auto messageStr = StringWithVAFormat(message, argList);
        va_end(argList);

        const ParseMessage msg{ParseMessage::ErrorMessage, "", messageStr};
        Messages.AddMessage(msg);
    }
}